

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_SimdInt16x8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  long lVar1;
  long lVar2;
  SIMDValue SVar3;
  int16 local_28;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  int16 values [8];
  
  lVar1 = *(long *)(this + 0x118);
  local_28 = *(int16 *)(lVar1 + (ulong)playout->I1 * 4);
  local_26 = *(undefined2 *)(lVar1 + (ulong)playout->I2 * 4);
  local_24 = *(undefined2 *)(lVar1 + (ulong)playout->I3 * 4);
  local_22 = *(undefined2 *)(lVar1 + (ulong)playout->I4 * 4);
  values[0] = *(int16 *)(lVar1 + (ulong)playout->I5 * 4);
  values[1] = *(int16 *)(lVar1 + (ulong)playout->I6 * 4);
  values[2] = *(int16 *)(lVar1 + (ulong)playout->I7 * 4);
  values[3] = *(int16 *)(lVar1 + (ulong)playout->I8 * 4);
  SVar3 = SIMDInt16x8Operation::OpInt16x8(&local_28);
  lVar1 = *(long *)(this + 0x148);
  lVar2 = (ulong)playout->I8_0 * 0x10;
  *(long *)(lVar1 + lVar2) = SVar3.field_0._0_8_;
  *(long *)(lVar1 + 8 + lVar2) = SVar3.field_0._8_8_;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdInt16x8(const unaligned T* playout)
    {
        int16 values[8];
        values[0] = (int16)GetRegRawInt(playout->I1);
        values[1] = (int16)GetRegRawInt(playout->I2);
        values[2] = (int16)GetRegRawInt(playout->I3);
        values[3] = (int16)GetRegRawInt(playout->I4);
        values[4] = (int16)GetRegRawInt(playout->I5);
        values[5] = (int16)GetRegRawInt(playout->I6);
        values[6] = (int16)GetRegRawInt(playout->I7);
        values[7] = (int16)GetRegRawInt(playout->I8);

        AsmJsSIMDValue result = SIMDInt16x8Operation::OpInt16x8(values);
        SetRegRawSimd(playout->I8_0, result);
    }